

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_empty(void)

{
  bool bVar1;
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)local_30,(value_type (*) [4])&span.member.next);
  bVar1 = vista::circular_view<int,_4UL>::empty((circular_view<int,_4UL> *)local_30);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x338,"void api_fixed_suite::fixed_empty()",bVar1);
  vista::circular_view<int,_4UL>::push_back((circular_view<int,_4UL> *)local_30,0xb);
  bVar1 = vista::circular_view<int,_4UL>::empty((circular_view<int,_4UL> *)local_30);
  boost::detail::test_impl
            ("!span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x33a,"void api_fixed_suite::fixed_empty()",(bool)(bVar1 - 1U & 1));
  return;
}

Assistant:

void fixed_empty()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    BOOST_TEST(span.empty());
    span.push_back(11);
    BOOST_TEST(!span.empty());
}